

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O0

int bio_read_full(BIO *bio,uint8_t *out,int *out_eof_on_first_read,size_t len)

{
  int iVar1;
  bool local_41;
  int local_40;
  int ret;
  int todo;
  int first_read;
  size_t len_local;
  int *out_eof_on_first_read_local;
  uint8_t *out_local;
  BIO *bio_local;
  
  local_41 = true;
  _todo = len;
  out_eof_on_first_read_local = (int *)out;
  while( true ) {
    if (_todo == 0) {
      return 1;
    }
    if (_todo < 0x80000000) {
      local_40 = (int)_todo;
    }
    else {
      local_40 = 0x7fffffff;
    }
    iVar1 = BIO_read((BIO *)bio,out_eof_on_first_read_local,local_40);
    if (iVar1 < 1) break;
    out_eof_on_first_read_local = (int *)((long)out_eof_on_first_read_local + (long)iVar1);
    _todo = _todo - (long)iVar1;
    local_41 = false;
  }
  if (out_eof_on_first_read != (int *)0x0) {
    local_41 = local_41 && iVar1 == 0;
    *out_eof_on_first_read = (uint)local_41;
  }
  return 0;
}

Assistant:

static int bio_read_full(BIO *bio, uint8_t *out, int *out_eof_on_first_read,
                         size_t len) {
  int first_read = 1;
  while (len > 0) {
    int todo = len <= INT_MAX ? (int)len : INT_MAX;
    int ret = BIO_read(bio, out, todo);
    if (ret <= 0) {
      if (out_eof_on_first_read != NULL) {
        *out_eof_on_first_read = first_read && ret == 0;
      }
      return 0;
    }
    out += ret;
    len -= (size_t)ret;
    first_read = 0;
  }

  return 1;
}